

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O2

void __thiscall proto3::IntToString::~IntToString(IntToString *this)

{
  ~IntToString(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

IntToString::~IntToString() {
  // @@protoc_insertion_point(destructor:proto3.IntToString)
  SharedDtor(*this);
}